

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_gather.cpp
# Opt level: O1

void duckdb::HeapGatherListVector
               (Vector *v,idx_t vcount,SelectionVector *sel,data_ptr_t *key_locations)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  uint64_t *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  uint64_t uVar7;
  bool bVar8;
  LogicalType *other;
  idx_t iVar9;
  idx_t source_size;
  Vector *vector;
  TemplatedValidityData<unsigned_long> *pTVar10;
  long lVar11;
  SelectionVector *sel_00;
  data_ptr_t pdVar12;
  uint64_t *puVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  uint64_t uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  unsigned_long next;
  LogicalType child_type;
  Vector append_vector;
  data_ptr_t list_entry_locations [2048];
  data_ptr_t local_4148;
  element_type *local_4128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_4120;
  list_entry_t *local_4110;
  SelectionVector *local_4108;
  data_ptr_t *local_4100;
  LogicalType *local_40f8;
  uint64_t local_40f0;
  ulong local_40e8;
  idx_t local_40e0;
  LogicalType local_40d8;
  idx_t local_40c0;
  LogicalType local_40b8;
  Vector local_40a0;
  data_ptr_t local_4038 [2049];
  
  local_4108 = sel;
  FlatVector::VerifyFlatVector(v);
  local_40f8 = &v->type;
  other = ListType::GetChildType(local_40f8);
  LogicalType::LogicalType(&local_40d8,other);
  local_4110 = ListVector::GetData(v);
  iVar9 = ListVector::GetListSize(v);
  if (vcount != 0) {
    uVar18 = 0;
    local_4100 = key_locations;
    do {
      uVar14 = uVar18;
      if (local_4108->sel_vector != (sel_t *)0x0) {
        uVar14 = (ulong)local_4108->sel_vector[uVar18];
      }
      puVar2 = (v->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)) {
        puVar3 = (uint64_t *)key_locations[uVar18];
        uVar15 = *puVar3;
        puVar13 = puVar3 + 1;
        key_locations[uVar18] = (data_ptr_t)puVar13;
        local_4110[uVar14].length = uVar15;
        local_4110[uVar14].offset = iVar9;
        key_locations[uVar18] = (data_ptr_t)((long)puVar3 + (uVar15 + 7 >> 3) + 8);
        bVar8 = TypeIsConstantSize(local_40d8.physical_type_);
        if (bVar8) {
          local_4148 = (data_ptr_t)0x0;
        }
        else {
          local_4148 = key_locations[uVar18];
          key_locations[uVar18] = local_4148 + uVar15 * 8;
        }
        if (uVar15 != 0) {
          lVar17 = 0;
          do {
            source_size = 0x800;
            if (uVar15 < 0x800) {
              source_size = uVar15;
            }
            local_40e8 = uVar15;
            local_40e0 = source_size;
            LogicalType::LogicalType(&local_40b8,local_40f8);
            Vector::Vector(&local_40a0,&local_40b8,0x800);
            LogicalType::~LogicalType(&local_40b8);
            Vector::SetVectorType(&local_40a0,v->vector_type);
            vector = ListVector::GetEntry(&local_40a0);
            local_40f0 = iVar9;
            FlatVector::VerifyFlatVector(vector);
            uVar16 = source_size + (source_size == 0);
            uVar14 = 0;
            do {
              puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (((byte)*puVar13 >> ((uint)lVar17 & 0x1f) & 1) == 0) {
                if (puVar2 == (unsigned_long *)0x0) {
                  local_40c0 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.
                               capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_4128,&local_40c0);
                  p_Var6 = p_Stack_4120;
                  peVar5 = local_4128;
                  local_4128 = (element_type *)0x0;
                  p_Stack_4120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar5;
                  (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var6;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_4120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_4120);
                  }
                  pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(vector->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar10->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar4 = (byte)uVar14 & 0x3f;
                puVar1 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (uVar14 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              }
              else if (puVar2 != (unsigned_long *)0x0) {
                puVar2[uVar14 >> 6] = puVar2[uVar14 >> 6] | 1L << ((byte)uVar14 & 0x3f);
              }
              lVar11 = lVar17 + 1;
              lVar17 = 0;
              if (lVar11 != 8) {
                lVar17 = lVar11;
              }
              puVar13 = (uint64_t *)((long)puVar13 + (ulong)(lVar11 == 8));
              uVar14 = uVar14 + 1;
            } while (uVar16 != uVar14);
            bVar8 = TypeIsConstantSize(local_40d8.physical_type_);
            key_locations = local_4100;
            if (bVar8) {
              iVar9 = GetTypeIdSize(local_40d8.physical_type_);
              pdVar12 = key_locations[uVar18];
              uVar14 = 0;
              do {
                local_4038[uVar14] = pdVar12;
                pdVar12 = pdVar12 + iVar9;
                uVar14 = uVar14 + 1;
              } while (uVar16 != uVar14);
              key_locations[uVar18] = pdVar12;
            }
            else {
              pdVar12 = local_4100[uVar18];
              lVar11 = 0;
              do {
                *(data_ptr_t *)((long)local_4038 + lVar11) = pdVar12;
                pdVar12 = pdVar12 + *(long *)(local_4148 + lVar11);
                local_4100[uVar18] = pdVar12;
                lVar11 = lVar11 + 8;
              } while (uVar16 * 8 != lVar11);
              local_4148 = local_4148 + lVar11;
            }
            sel_00 = FlatVector::IncrementalSelectionVector();
            RowOperations::HeapGather
                      (vector,&local_40e0,sel_00,local_4038,
                       (optional_ptr<duckdb::NestedValidity,_true>)0x0);
            ListVector::Append(v,vector,source_size,0);
            if (local_40a0.auxiliary.internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40a0.auxiliary.internal.
                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            uVar7 = local_40f0;
            if (local_40a0.buffer.internal.
                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40a0.buffer.internal.
                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_40a0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40a0.validity.super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            uVar15 = local_40e8 - source_size;
            iVar9 = uVar7 + source_size;
            LogicalType::~LogicalType(&local_40a0.type);
          } while (uVar15 != 0);
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != vcount);
  }
  LogicalType::~LogicalType(&local_40d8);
  return;
}

Assistant:

static void HeapGatherListVector(Vector &v, const idx_t vcount, const SelectionVector &sel, data_ptr_t *key_locations) {
	const auto &validity = FlatVector::Validity(v);

	auto child_type = ListType::GetChildType(v.GetType());
	auto list_data = ListVector::GetData(v);
	data_ptr_t list_entry_locations[STANDARD_VECTOR_SIZE];

	uint64_t entry_offset = ListVector::GetListSize(v);
	for (idx_t i = 0; i < vcount; i++) {
		const auto col_idx = sel.get_index(i);
		if (!validity.RowIsValid(col_idx)) {
			continue;
		}
		// read list length
		auto entry_remaining = Load<uint64_t>(key_locations[i]);
		key_locations[i] += sizeof(uint64_t);
		// set list entry attributes
		list_data[col_idx].length = entry_remaining;
		list_data[col_idx].offset = entry_offset;
		// skip over the validity mask
		data_ptr_t validitymask_location = key_locations[i];
		idx_t offset_in_byte = 0;
		key_locations[i] += (entry_remaining + 7) / 8;
		// entry sizes
		data_ptr_t var_entry_size_ptr = nullptr;
		if (!TypeIsConstantSize(child_type.InternalType())) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += entry_remaining * sizeof(idx_t);
		}

		// now read the list data
		while (entry_remaining > 0) {
			auto next = MinValue(entry_remaining, (idx_t)STANDARD_VECTOR_SIZE);

			// initialize a new vector to append
			Vector append_vector(v.GetType());
			append_vector.SetVectorType(v.GetVectorType());

			auto &list_vec_to_append = ListVector::GetEntry(append_vector);

			// set validity
			//! Since we are constructing the vector, this will always be a flat vector.
			auto &append_validity = FlatVector::Validity(list_vec_to_append);
			for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
				append_validity.Set(entry_idx, *(validitymask_location) & (1 << offset_in_byte));
				if (++offset_in_byte == 8) {
					validitymask_location++;
					offset_in_byte = 0;
				}
			}

			// compute entry sizes and set locations where the list entries are
			if (TypeIsConstantSize(child_type.InternalType())) {
				// constant size list entries
				const idx_t type_size = GetTypeIdSize(child_type.InternalType());
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += type_size;
				}
			} else {
				// variable size list entries
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += Load<idx_t>(var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
				}
			}

			// now deserialize and add to listvector
			RowOperations::HeapGather(list_vec_to_append, next, *FlatVector::IncrementalSelectionVector(),
			                          list_entry_locations, nullptr);
			ListVector::Append(v, list_vec_to_append, next);

			// update for next iteration
			entry_remaining -= next;
			entry_offset += next;
		}
	}
}